

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec6PickBestMux(word t,word *Cofs)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int local_2c;
  int CountBest;
  int Count1;
  int Count0;
  int vBest;
  int v;
  word *Cofs_local;
  word t_local;
  
  Count1 = -1;
  local_2c = 1000;
  for (Count0 = 0; Count0 < 6; Count0 = Count0 + 1) {
    wVar3 = If_Dec6Cofactor(t,Count0,0);
    iVar1 = If_Dec6SuppSize(wVar3);
    wVar3 = If_Dec6Cofactor(t,Count0,1);
    iVar2 = If_Dec6SuppSize(wVar3);
    if (((iVar1 < 5) && (iVar2 < 5)) && (iVar1 + iVar2 < local_2c)) {
      local_2c = iVar1 + iVar2;
      Count1 = Count0;
      wVar3 = If_Dec6Cofactor(t,Count0,0);
      *Cofs = wVar3;
      wVar3 = If_Dec6Cofactor(t,Count0,1);
      Cofs[1] = wVar3;
    }
  }
  return Count1;
}

Assistant:

int If_Dec6PickBestMux( word t, word Cofs[2] )
{
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 6; v++ )
    {
        Count0 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 0) );
        Count1 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 1) );
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            Cofs[0] = If_Dec6Cofactor(t, v, 0);
            Cofs[1] = If_Dec6Cofactor(t, v, 1);
        }
    }
    return vBest;
}